

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::checkNoShaderLayouts
          (TParseContext *this,TSourceLoc *loc,TShaderQualifiers *shaderQualifiers)

{
  bool bVar1;
  char *pcVar2;
  int local_2c;
  int i;
  char *message;
  TShaderQualifiers *shaderQualifiers_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  if (shaderQualifiers->geometry != ElgNone) {
    pcVar2 = TQualifier::getGeometryString(shaderQualifiers->geometry);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",pcVar2,"");
  }
  if (shaderQualifiers->spacing != EvsNone) {
    pcVar2 = TQualifier::getVertexSpacingString(shaderQualifiers->spacing);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",pcVar2,"");
  }
  if (shaderQualifiers->order != EvoNone) {
    pcVar2 = TQualifier::getVertexOrderString(shaderQualifiers->order);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",pcVar2,"");
  }
  if ((shaderQualifiers->pointMode & 1U) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","point_mode","");
  }
  if (shaderQualifiers->invocations != -1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","invocations","");
  }
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    if (1 < shaderQualifiers->localSize[local_2c]) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to a standalone qualifier","local_size","");
    }
    if (shaderQualifiers->localSizeSpecId[local_2c] != -1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to a standalone qualifier","local_size id","");
    }
  }
  if (shaderQualifiers->vertices != -1) {
    if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) ||
       ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to a standalone qualifier","max_vertices","");
    }
    else {
      if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessControl) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                      ,0x1c79,
                      "void glslang::TParseContext::checkNoShaderLayouts(const TSourceLoc &, const TShaderQualifiers &)"
                     );
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to a standalone qualifier","vertices","");
    }
  }
  if ((shaderQualifiers->earlyFragmentTests & 1U) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","early_fragment_tests","");
  }
  if ((shaderQualifiers->postDepthCoverage & 1U) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","post_depth_coverage","");
  }
  if ((shaderQualifiers->nonCoherentColorAttachmentReadEXT & 1U) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",
               "non_coherent_color_attachment_readEXT","");
  }
  if ((shaderQualifiers->nonCoherentDepthAttachmentReadEXT & 1U) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",
               "non_coherent_depth_attachment_readEXT","");
  }
  if ((shaderQualifiers->nonCoherentStencilAttachmentReadEXT & 1U) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",
               "non_coherent_stencil_attachment_readEXT","");
  }
  if (shaderQualifiers->primitives != -1) {
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x1c89,
                    "void glslang::TParseContext::checkNoShaderLayouts(const TSourceLoc &, const TShaderQualifiers &)"
                   );
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","max_primitives","");
  }
  bVar1 = TShaderQualifiers::hasBlendEquation(shaderQualifiers);
  if (bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","blend equation","");
  }
  if (shaderQualifiers->numViews != -1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","num_views","");
  }
  if (shaderQualifiers->interlockOrdering != EioNone) {
    pcVar2 = TQualifier::getInterlockOrderingString(shaderQualifiers->interlockOrdering);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",pcVar2,"");
  }
  if ((shaderQualifiers->layoutPrimitiveCulling & 1U) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only be applied as standalone","primitive_culling","");
  }
  return;
}

Assistant:

void TParseContext::checkNoShaderLayouts(const TSourceLoc& loc, const TShaderQualifiers& shaderQualifiers)
{
    const char* message = "can only apply to a standalone qualifier";

    if (shaderQualifiers.geometry != ElgNone)
        error(loc, message, TQualifier::getGeometryString(shaderQualifiers.geometry), "");
    if (shaderQualifiers.spacing != EvsNone)
        error(loc, message, TQualifier::getVertexSpacingString(shaderQualifiers.spacing), "");
    if (shaderQualifiers.order != EvoNone)
        error(loc, message, TQualifier::getVertexOrderString(shaderQualifiers.order), "");
    if (shaderQualifiers.pointMode)
        error(loc, message, "point_mode", "");
    if (shaderQualifiers.invocations != TQualifier::layoutNotSet)
        error(loc, message, "invocations", "");
    for (int i = 0; i < 3; ++i) {
        if (shaderQualifiers.localSize[i] > 1)
            error(loc, message, "local_size", "");
        if (shaderQualifiers.localSizeSpecId[i] != TQualifier::layoutNotSet)
            error(loc, message, "local_size id", "");
    }
    if (shaderQualifiers.vertices != TQualifier::layoutNotSet) {
        if (language == EShLangGeometry || language == EShLangMesh)
            error(loc, message, "max_vertices", "");
        else if (language == EShLangTessControl)
            error(loc, message, "vertices", "");
        else
            assert(0);
    }
    if (shaderQualifiers.earlyFragmentTests)
        error(loc, message, "early_fragment_tests", "");
    if (shaderQualifiers.postDepthCoverage)
        error(loc, message, "post_depth_coverage", "");
    if (shaderQualifiers.nonCoherentColorAttachmentReadEXT)
        error(loc, message, "non_coherent_color_attachment_readEXT", "");
    if (shaderQualifiers.nonCoherentDepthAttachmentReadEXT)
        error(loc, message, "non_coherent_depth_attachment_readEXT", "");
    if (shaderQualifiers.nonCoherentStencilAttachmentReadEXT)
        error(loc, message, "non_coherent_stencil_attachment_readEXT", "");
    if (shaderQualifiers.primitives != TQualifier::layoutNotSet) {
        if (language == EShLangMesh)
            error(loc, message, "max_primitives", "");
        else
            assert(0);
    }
    if (shaderQualifiers.hasBlendEquation())
        error(loc, message, "blend equation", "");
    if (shaderQualifiers.numViews != TQualifier::layoutNotSet)
        error(loc, message, "num_views", "");
    if (shaderQualifiers.interlockOrdering != EioNone)
        error(loc, message, TQualifier::getInterlockOrderingString(shaderQualifiers.interlockOrdering), "");
    if (shaderQualifiers.layoutPrimitiveCulling)
        error(loc, "can only be applied as standalone", "primitive_culling", "");
}